

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

int aa_index(char aa)

{
  uint uVar1;
  ostream *poVar2;
  invalid_argument *this;
  
  uVar1 = (byte)aa - 0x41;
  if (((byte)uVar1 < 0x19) && ((0x16fbdfdU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(int *)(&DAT_00140604 + (ulong)(uVar1 & 0xff) * 4);
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)aa);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,aa);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"no char found");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int aa_index(char aa) {
    switch (aa) {
        case 'A': return 0;
        case 'R': return 1;
        case 'N': return 2;
        case 'D': return 3;
        case 'C': return 4;
        case 'Q': return 5;
        case 'E': return 6;
        case 'G': return 7;
        case 'H': return 8;
        case 'M': return 9;
        case 'I': return 10;
        case 'L': return 11;
        case 'K': return 12;
        case 'F': return 13;
        case 'P': return 14;
        case 'S': return 15;
        case 'T': return 16;
        case 'W': return 17;
        case 'Y': return 18;
        case 'V': return 19;
        default:
            cout << (int)aa << " " << (char)aa << endl;
            throw invalid_argument("no char found");
    }
}